

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoll.c
# Opt level: O2

int ffpclx(fitsfile *fptr,int colnum,LONGLONG frow,long fbit,long nbit,char *larray,int *status)

{
  FITSfile *pFVar1;
  fitsfile *fptr_00;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong firstelem;
  long lVar5;
  byte local_c9;
  fitsfile *local_c8;
  long local_c0;
  long local_b8;
  LONGLONG local_b0;
  long local_a8;
  uint local_a0;
  int tcode;
  tcolumn *local_98;
  LONGLONG heapoffset;
  int hdutype;
  int maxelem;
  LONGLONG lrepeat;
  double dummyd;
  long incre;
  long twidth;
  LONGLONG tnull;
  LONGLONG elemnum;
  LONGLONG rowlen;
  char snull [12];
  char tform [12];
  
  if (nbit < 1 || 0 < *status) {
    return *status;
  }
  if (frow < 1) {
    *status = 0x133;
    return 0x133;
  }
  if (fbit < 1) {
LAB_0019d887:
    *status = 0x134;
    iVar2 = 0x134;
  }
  else {
    local_c0 = CONCAT44(local_c0._4_4_,colnum);
    local_c8 = fptr;
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart != -1) || (iVar2 = ffrdef(fptr,status), iVar2 < 1))
      goto LAB_0019d734;
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
LAB_0019d734:
      firstelem = fbit + 7U >> 3;
      iVar2 = ffgcprll(local_c8,(int)local_c0,frow,firstelem,
                       ((nbit + fbit + 6U >> 3) - firstelem) + 1,1,&dummyd,&dummyd,tform,&twidth,
                       &tcode,&maxelem,&local_b8,&elemnum,&incre,&local_b0,&rowlen,&hdutype,&tnull,
                       snull,status);
      fptr_00 = local_c8;
      if (iVar2 < 1) {
        pFVar1 = local_c8->Fptr;
        local_a0 = pFVar1->tableptr[(long)(int)local_c0 + -1].tdatatype;
        uVar3 = -local_a0;
        if (0 < (int)local_a0) {
          uVar3 = local_a0;
        }
        if (0xb < uVar3) {
          *status = 0x136;
          return 0x136;
        }
        local_a8 = frow + -1;
        local_98 = pFVar1->tableptr + (int)local_c0;
        tcode = local_a0;
        if ((int)local_a0 < 1) {
          local_b0 = fbit + nbit + -1;
          if (local_a0 == 0xffffffff) {
            ffgdesll(local_c8,(int)local_c0,frow,&lrepeat,&heapoffset,status);
            ffpdes(fptr_00,(int)local_c0,frow,local_b0,heapoffset,status);
          }
        }
        else {
          local_b0 = local_98[-1].trepeat;
          if (local_a0 == 1) {
            local_b0 = (local_b0 + 7) / 8;
          }
          if (local_b0 < (long)firstelem) goto LAB_0019d887;
          local_b8 = pFVar1->rowlength * local_a8 + pFVar1->datastart + local_98[-1].tbcol;
        }
        uVar4 = (ulong)((uint)(fbit + 7U) & 7);
        local_c0 = firstelem - 1;
        local_b8 = local_b8 + local_c0;
        ffmbyt(local_c8,local_b8,1,status);
        lVar5 = 0;
        while( true ) {
          iVar2 = ffgbyt(local_c8,1,&local_c9,status);
          if (iVar2 == 0x6b) {
            *status = 0;
            local_c9 = 0;
          }
          ffmbyt(local_c8,local_b8,1,status);
          for (; (uVar4 < 8 && (lVar5 < nbit)); lVar5 = lVar5 + 1) {
            if (larray[lVar5] == '\0') {
              local_c9 = local_c9 & ffpclx::offbit[uVar4];
            }
            else {
              local_c9 = local_c9 | ffpclx::onbit[uVar4];
            }
            uVar4 = uVar4 + 1;
          }
          ffpbyt(local_c8,1,&local_c9,status);
          if (nbit == lVar5) break;
          local_b8 = local_b8 + 1;
          uVar4 = 0;
          if (0 < (int)local_a0) {
            local_c0 = local_c0 + 1;
            uVar4 = 0;
            if (local_c0 == local_b0) {
              local_a8 = local_a8 + 1;
              local_b8 = local_c8->Fptr->rowlength * local_a8 + local_c8->Fptr->datastart +
                         local_98[-1].tbcol;
              ffmbyt(local_c8,local_b8,1,status);
              local_c0 = 0;
              uVar4 = 0;
            }
          }
        }
      }
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffpclx( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  frow,      /* I - first row to write (1 = 1st row)        */
            long  fbit,      /* I - first bit to write (1 = 1st)            */
            long  nbit,      /* I - number of bits to write                 */
            char *larray,    /* I - array of logicals corresponding to bits */
            int  *status)    /* IO - error status                           */
/*
  write an array of logical values to a specified bit or byte
  column of the binary table.   If larray is TRUE, then the corresponding
  bit is set to 1, otherwise it is set to 0.
  The binary table column being written to must have datatype 'B' or 'X'. 
*/
{
    LONGLONG offset, bstart, repeat, rowlen, elemnum, rstart, estart, tnull;
    long fbyte, lbyte, nbyte, bitloc, ndone;
    long ii, twidth, incre;
    int tcode, descrp, maxelem, hdutype;
    double dummyd;
    char tform[12], snull[12];
    unsigned char cbuff;
    static unsigned char onbit[8] = {128,  64,  32,  16,   8,   4,   2,   1};
    static unsigned char offbit[8] = {127, 191, 223, 239, 247, 251, 253, 254};
    LONGLONG heapoffset, lrepeat;
    tcolumn *colptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*  check input parameters */
    if (nbit < 1)
        return(*status);
    else if (frow < 1)
        return(*status = BAD_ROW_NUM);
    else if (fbit < 1)
        return(*status = BAD_ELEM_NUM);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    fbyte = (fbit + 7) / 8;
    lbyte = (fbit + nbit + 6) / 8;
    nbyte = lbyte - fbyte +1;

    /* Save the current heapsize; ffgcprll will increment the value if */
    /* we are writing to a variable length column. */
    offset = (fptr->Fptr)->heapsize;

    /* call ffgcprll in case we are writing beyond the current end of   */
    /* the table; it will allocate more space and shift any following */
    /* HDU's.  Otherwise, we have little use for most of the returned */
    /* parameters, therefore just use dummy parameters.               */

    if (ffgcprll( fptr, colnum, frow, fbyte, nbyte, 1, &dummyd, &dummyd,
        tform, &twidth, &tcode, &maxelem, &bstart, &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

    bitloc = fbit - 1 - ((fbit - 1) / 8 * 8);
    ndone = 0;
    rstart = frow - 1;
    estart = fbyte - 1;

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode = colptr->tdatatype;

    if (abs(tcode) > TBYTE)
        return(*status = NOT_LOGICAL_COL); /* not correct datatype column */

    if (tcode > 0)
    {
        descrp = FALSE;  /* not a variable length descriptor column */
        repeat = colptr->trepeat;

        if (tcode == TBIT)
            repeat = (repeat + 7) / 8; /* convert from bits to bytes */

        if (fbyte > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol + estart;
    }
    else
    {
        descrp = TRUE;  /* a variable length descriptor column */
        /* only bit arrays (tform = 'X') are supported for variable */
        /* length arrays.  REPEAT is the number of BITS in the array. */

        repeat = fbit + nbit -1;

        /* write the number of elements and the starting offset.    */
        /* Note: ffgcprll previous wrote the descripter, but with the */
        /* wrong repeat value  (gave bytes instead of bits).        */
        /* Make sure to not change the current heap offset value!  */

        if (tcode == -TBIT) {
            ffgdesll(fptr, colnum, frow, &lrepeat, &heapoffset, status);
            ffpdes(  fptr, colnum, frow, (long) repeat, heapoffset, status);
	}

        /* Calc the i/o pointer location to start of sequence of pixels.   */
        /* ffgcprll has already calculated a value for bstart that         */
        /* points to the first element of the vector; we just have to      */
        /* increment it to point to the first element we want to write to. */
        /* Note: ffgcprll also already updated the size of the heap, so we */
        /* don't have to do that again here.                               */

        bstart += estart;
    }

    /* move the i/o pointer to the start of the pixel sequence */
    ffmbyt(fptr, bstart, IGNORE_EOF, status);

    /* read the next byte (we may only be modifying some of the bits) */
    while (1)
    {
      if (ffgbyt(fptr, 1, &cbuff, status) == END_OF_FILE)
      {
        /* hit end of file trying to read the byte, so just set byte = 0 */
        *status = 0;
        cbuff = 0;
      }

      /* move back, to be able to overwrite the byte */
      ffmbyt(fptr, bstart, IGNORE_EOF, status);
 
      for (ii = bitloc; (ii < 8) && (ndone < nbit); ii++, ndone++)
      {
        if(larray[ndone])
          cbuff = cbuff | onbit[ii];
        else
          cbuff = cbuff & offbit[ii];
      }

      ffpbyt(fptr, 1, &cbuff, status); /* write the modified byte */
      if (ndone == nbit)  /* finished all the bits */
        return(*status);

      /* not done, so get the next byte */
      bstart++;
      if (!descrp)
      {
        estart++;
        if (estart == repeat)
        {
          /* move the i/o pointer to the next row of pixels */
          estart = 0;
          rstart = rstart + 1;
          bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol;

          ffmbyt(fptr, bstart, IGNORE_EOF, status);
        }
      }
      bitloc = 0;
    }
}